

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  long lVar1;
  uint32_t uVar2;
  bool bVar3;
  char *pcVar4;
  string *psVar5;
  string *extraout_RAX;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char cVar10;
  char *pcVar11;
  int iVar12;
  char local_40 [16];
  
  if (this->unknown_ != (string *)0x0) {
    uVar7 = (ulong)(num * 8 + 3);
    cVar10 = (char)this->unknown_;
    if (0x7f < num * 8) {
      do {
        std::__cxx11::string::push_back(cVar10);
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar7 >> 7;
      } while (bVar3);
    }
    std::__cxx11::string::push_back(cVar10);
  }
  iVar8 = ctx->depth_;
  lVar1 = (long)iVar8 + -1;
  iVar12 = (int)lVar1;
  ctx->depth_ = iVar12;
  if ((long)iVar8 < 1) {
    pcVar11 = (char *)0x0;
  }
  else {
    lVar9 = (long)ctx->group_depth_ + 1;
    iVar8 = (int)lVar9;
    ctx->group_depth_ = iVar8;
    pcVar4 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar4 != (char *)0x0) {
      if (iVar12 == ctx->depth_) {
        psVar5 = (string *)0x0;
      }
      else {
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar1,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar5 != (string *)0x0) {
        ParseGroup();
        psVar5 = extraout_RAX;
LAB_00177424:
        pcVar11 = local_40;
        ParseGroup();
        sVar6 = strlen((char *)psVar5);
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (pcVar11,sVar6,psVar5);
        return pcVar11;
      }
      if (iVar8 == ctx->group_depth_) {
        psVar5 = (string *)0x0;
      }
      else {
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar9,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (psVar5 != (string *)0x0) goto LAB_00177424;
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar11 = (char *)0x0;
    if (uVar2 == num * 8 + 3) {
      pcVar11 = pcVar4;
    }
  }
  if (pcVar11 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else if (this->unknown_ != (string *)0x0) {
    uVar7 = (ulong)(num << 3 | 4);
    cVar10 = (char)this->unknown_;
    if (0x7f < num << 3) {
      do {
        std::__cxx11::string::push_back(cVar10);
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar7 >> 7;
      } while (bVar3);
    }
    std::__cxx11::string::push_back(cVar10);
  }
  return pcVar11;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }